

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

void raviV_op_setupvali(lua_State *L,LClosure *cl,TValue *ra,int b)

{
  double dVar1;
  UpVal *pUVar2;
  Value *pVVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ushort uVar6;
  Value in_R8;
  double dVar7;
  undefined1 auVar8 [16];
  
  uVar6 = 1;
  if (ra->tt_ == 3) {
    dVar1 = (ra->value_).n;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = dVar1;
    auVar8 = vroundsd_avx(auVar8,auVar8,9);
    dVar7 = auVar8._0_8_;
    if ((dVar7 == dVar1) && (!NAN(dVar7) && !NAN(dVar1))) {
      uVar4 = vcmppd_avx512vl(auVar8,ZEXT816(0x43e0000000000000),5);
      uVar5 = vcmppd_avx512vl(ZEXT816(0xc3e0000000000000),auVar8,6);
      uVar6 = (ushort)uVar5 & 3 | (ushort)uVar4 & 3;
      in_R8.i = (lua_Integer)dVar7;
    }
  }
  else if (ra->tt_ == 0x13) {
    in_R8 = ra->value_;
    goto LAB_00130428;
  }
  if ((uVar6 & 1) != 0) {
    luaG_runerror(L,"upvalue of integer type, cannot be set to non integer value");
  }
LAB_00130428:
  pUVar2 = cl->upvals[b];
  pVVar3 = &pUVar2->v->value_;
  *pVVar3 = in_R8;
  *(undefined2 *)(pVVar3 + 1) = 0x13;
  if (((short)ra->tt_ < 0) && (pUVar2->v == (TValue *)&pUVar2->u)) {
    luaC_upvalbarrier_(L,(ra->value_).gc);
    return;
  }
  return;
}

Assistant:

void raviV_op_setupvali(lua_State *L, LClosure *cl, TValue *ra, int b) {
  lua_Integer ia;
  if (tointegerns(ra, &ia)) {
    UpVal *uv = cl->upvals[b];
    setivalue(uv->v, ia);
    luaC_upvalbarrier(L, uv, ra);
  }
  else
    luaG_runerror(
        L, "upvalue of integer type, cannot be set to non integer value");
}